

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O1

CompilationOptions * __thiscall
slang::Bag::getOrDefault<slang::ast::CompilationOptions>
          (CompilationOptions *__return_storage_ptr__,Bag *this)

{
  uint32_t uVar1;
  CompilationOptions *pCVar2;
  long lVar3;
  size_t sVar4;
  CompilationOptions *pCVar5;
  CompilationOptions *pCVar6;
  byte bVar7;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_19;
  
  bVar7 = 0;
  pCVar2 = get<slang::ast::CompilationOptions>(this);
  if (pCVar2 == (CompilationOptions *)0x0) {
    memset(__return_storage_ptr__,0,0xa8);
    __return_storage_ptr__->flags = 0x10;
    __return_storage_ptr__->maxInstanceDepth = 0x80;
    __return_storage_ptr__->maxCheckerInstanceDepth = 0x40;
    __return_storage_ptr__->maxGenerateSteps = 0x20000;
    __return_storage_ptr__->maxConstexprDepth = 0x80;
    __return_storage_ptr__->maxConstexprSteps = 1000000;
    __return_storage_ptr__->maxConstexprBacktrace = 10;
    __return_storage_ptr__->maxDefParamSteps = 0x80;
    __return_storage_ptr__->maxInstanceArray = 0xffff;
    __return_storage_ptr__->maxRecursiveClassSpecialization = 8;
    __return_storage_ptr__->maxUDPCoverageNotes = 8;
    __return_storage_ptr__->errorLimit = 0x40;
    __return_storage_ptr__->typoCorrectionLimit = 0x20;
    __return_storage_ptr__->minTypMax = Typ;
    __return_storage_ptr__->languageVersion = Default;
    (__return_storage_ptr__->defaultTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
    (__return_storage_ptr__->topModules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_size_index = 0x3f;
    (__return_storage_ptr__->topModules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_size_mask = 1;
    (__return_storage_ptr__->topModules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_ = (group_type_pointer)0x0;
    (__return_storage_ptr__->topModules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.elements_ = (value_type_pointer)0x0;
    (__return_storage_ptr__->topModules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .arrays.groups_ =
         (group_type_pointer)
         &boost::unordered::detail::foa::
          dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
          ::storage;
    sVar4 = 0x1d;
    if ((__return_storage_ptr__->topModules).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .arrays.elements_ == (value_type_pointer)0x0) {
      sVar4 = 0;
    }
    (__return_storage_ptr__->topModules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .size_ctrl.ml = sVar4;
    (__return_storage_ptr__->topModules).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
    .size_ctrl.size = 0;
    (__return_storage_ptr__->paramOverrides).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->paramOverrides).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->paramOverrides).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->defaultLiblist).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->defaultLiblist).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->defaultLiblist).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pCVar5 = pCVar2;
    pCVar6 = __return_storage_ptr__;
    for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = pCVar5->maxInstanceDepth;
      pCVar6->flags = (bitmask<slang::ast::CompilationFlags>)(pCVar5->flags).m_bits;
      pCVar6->maxInstanceDepth = uVar1;
      pCVar5 = (CompilationOptions *)((long)pCVar5 + (ulong)bVar7 * -0x10 + 8);
      pCVar6 = (CompilationOptions *)((long)pCVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    (__return_storage_ptr__->defaultTimeScale).super__Optional_base<slang::TimeScale,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged =
         (pCVar2->defaultTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
         super__Optional_payload_base<slang::TimeScale>._M_engaged;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&__return_storage_ptr__->topModules,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&pCVar2->topModules,&local_19);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->paramOverrides,&pCVar2->paramOverrides);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&__return_storage_ptr__->defaultLiblist,&pCVar2->defaultLiblist);
  }
  return __return_storage_ptr__;
}

Assistant:

T getOrDefault() const {
        const T* result = get<T>();
        if (result)
            return *result;
        return T();
    }